

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O2

void __thiscall Nova::Example<float,_1>::Register_Options(Example<float,_1> *this)

{
  Parse_Args *pPVar1;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pPVar1 = this->parse_args;
  if (pPVar1 != (Parse_Args *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"-o",&local_93);
    std::__cxx11::string::string((string *)&local_70,"",&local_94);
    std::__cxx11::string::string((string *)&local_90,"output directory",&local_91);
    std::__cxx11::string::string((string *)&local_30,"",&local_92);
    Parse_Args::Add_String_Argument(pPVar1,&local_50,&local_70,&local_90,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar1 = this->parse_args;
    std::__cxx11::string::string((string *)&local_50,"-restart",(allocator *)&local_30);
    std::__cxx11::string::string((string *)&local_70,"frame",&local_93);
    std::__cxx11::string::string((string *)&local_90,"restart frame",&local_94);
    Parse_Args::Add_Integer_Argument(pPVar1,&local_50,0,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar1 = this->parse_args;
    std::__cxx11::string::string((string *)&local_50,"-test_number",(allocator *)&local_30);
    std::__cxx11::string::string((string *)&local_70,"test",&local_93);
    std::__cxx11::string::string((string *)&local_90,"test number",&local_94);
    Parse_Args::Add_Integer_Argument(pPVar1,&local_50,1,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar1 = this->parse_args;
    std::__cxx11::string::string((string *)&local_50,"-substeps",(allocator *)&local_30);
    std::__cxx11::string::string((string *)&local_70,"level",&local_93);
    std::__cxx11::string::string((string *)&local_90,"substep output level",&local_94);
    Parse_Args::Add_Integer_Argument(pPVar1,&local_50,-1,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar1 = this->parse_args;
    std::__cxx11::string::string((string *)&local_50,"-first_frame",(allocator *)&local_30);
    std::__cxx11::string::string((string *)&local_70,"frame",&local_93);
    std::__cxx11::string::string((string *)&local_90,"first frame",&local_94);
    Parse_Args::Add_Integer_Argument(pPVar1,&local_50,0,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar1 = this->parse_args;
    std::__cxx11::string::string((string *)&local_50,"-last_frame",(allocator *)&local_30);
    std::__cxx11::string::string((string *)&local_70,"frame",&local_93);
    std::__cxx11::string::string((string *)&local_90,"last frame",&local_94);
    Parse_Args::Add_Integer_Argument(pPVar1,&local_50,0,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pPVar1 = this->parse_args;
    std::__cxx11::string::string((string *)&local_50,"-framerate",(allocator *)&local_30);
    std::__cxx11::string::string((string *)&local_70,"frame rate",&local_93);
    std::__cxx11::string::string((string *)&local_90,"",&local_94);
    Parse_Args::Add_Double_Argument(pPVar1,&local_50,24.0,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Example<T,d>::
Register_Options()
{
    if(!parse_args) return;
    parse_args->Add_String_Argument("-o","","output directory");
    parse_args->Add_Integer_Argument("-restart",0,"frame","restart frame");
    parse_args->Add_Integer_Argument("-test_number",1,"test","test number");
    parse_args->Add_Integer_Argument("-substeps",-1,"level","substep output level");
    parse_args->Add_Integer_Argument("-first_frame",0,"frame","first frame");
    parse_args->Add_Integer_Argument("-last_frame",0,"frame","last frame");
    parse_args->Add_Double_Argument("-framerate",24,"frame rate");
}